

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VScaleAddMulti_Serial(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (0 < nvec) {
    if (nvec == 1) {
      N_VLinearSum_Serial(*a,x,1.0,*Y,*Z);
    }
    else {
      lVar1 = *x->content;
      lVar2 = *(long *)((long)x->content + 0x10);
      lVar3 = 0;
      if (0 < lVar1) {
        lVar3 = lVar1;
      }
      if (Y == Z) {
        for (uVar4 = 0; uVar4 != (uint)nvec; uVar4 = uVar4 + 1) {
          lVar1 = *(long *)((long)Y[uVar4]->content + 0x10);
          for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
            *(double *)(lVar1 + lVar5 * 8) =
                 a[uVar4] * *(double *)(lVar2 + lVar5 * 8) + *(double *)(lVar1 + lVar5 * 8);
          }
        }
      }
      else {
        for (uVar4 = 0; uVar4 != (uint)nvec; uVar4 = uVar4 + 1) {
          lVar1 = *(long *)((long)Y[uVar4]->content + 0x10);
          lVar5 = *(long *)((long)Z[uVar4]->content + 0x10);
          for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
            *(double *)(lVar5 + lVar6 * 8) =
                 a[uVar4] * *(double *)(lVar2 + lVar6 * 8) + *(double *)(lVar1 + lVar6 * 8);
          }
        }
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VScaleAddMulti_Serial(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VLinearSum */
  if (nvec == 1) {
    N_VLinearSum_Serial(a[0], x, ONE, Y[0], Z[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z) {
    for (i=0; i<nvec; i++) {
      yd = NV_DATA_S(Y[i]);
      for (j=0; j<N; j++) {
        yd[j] += a[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = a[i] * xd[j] + yd[j];
    }
  }
  return(0);
}